

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void spawn_characters(tgestate_t *state)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  char cVar8;
  characterstruct_t *charstr;
  
  bVar5 = (state->map_position).x;
  bVar4 = (state->map_position).y;
  bVar3 = bVar5 - 8;
  if (bVar5 < 8) {
    bVar3 = 0;
  }
  bVar5 = bVar4 - 8;
  if (bVar4 < 8) {
    bVar5 = 0;
  }
  charstr = state->character_structs;
  bVar4 = bVar5 + 0x20;
  if (0xdf < bVar5) {
    bVar4 = 0xff;
  }
  bVar6 = bVar3 + 0x28;
  if (0xd7 < bVar3) {
    bVar6 = 0xff;
  }
  cVar8 = -0x1a;
  do {
    if (((charstr->character_and_flags & 0x40) == 0) && (state->room_index == charstr->room)) {
      if (state->room_index == '\0') {
        uVar1 = (charstr->mappos).u;
        uVar2 = (charstr->mappos).v;
        bVar7 = -(uVar1 + uVar2 + (charstr->mappos).w);
        if ((((bVar7 <= bVar5) || (bVar4 < bVar7)) ||
            (bVar7 = (uVar2 - uVar1) * '\x02' + 0x80, bVar7 <= bVar3)) || (bVar6 < bVar7))
        goto LAB_00105915;
      }
      spawn_character(state,charstr);
    }
LAB_00105915:
    charstr = charstr + 1;
    cVar8 = cVar8 + '\x01';
    if (cVar8 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void spawn_characters(tgestate_t *state)
{
  /* Size, in UDGs, of a buffer zone around the visible screen in which
   * visible characters will spawn. */
  enum { GRACE = 8 };

  uint8_t            map_y, map_x;                  /* was H, L */
  uint8_t            map_y_clamped, map_x_clamped;  /* was D, E */
  characterstruct_t *charstr;                       /* was HL */
  uint8_t            iters;                         /* was B */
  room_t             room;                          /* was A */
  uint8_t            y, x;                          /* was C, A */

  assert(state != NULL);

  /* Form a clamped map position in (map_x, map_y). */
  map_x = state->map_position.x;
  map_y = state->map_position.y;
  map_x_clamped = (map_x < GRACE) ? 0 : map_x - GRACE;
  map_y_clamped = (map_y < GRACE) ? 0 : map_y - GRACE;

  /* Walk all character structs. */
  charstr = &state->character_structs[0];
  iters   = character_structs__LIMIT;
  do
  {
    if ((charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN) == 0)
    {
      /* Is this character in the current room? */
      if ((room = state->room_index) == charstr->room)
      {
        if (room == room_0_OUTDOORS)
        {
          /* Handle outdoors. */

          /* Do screen Y calculation.
           * The 0x100 here is represented as zero in the original game. */
          y = 0x100 - charstr->mappos.u - charstr->mappos.v - charstr->mappos.w;
          if (y <= map_y_clamped || // <= might need to be <
              y > MIN(map_y_clamped + GRACE + 16 + GRACE, 0xFF))
            goto skip;

          /* Do screen X calculation. */
          x = (0x40 - charstr->mappos.u + charstr->mappos.v) * 2;
          if (x <= map_x_clamped || // <= might need to be <
              x > MIN(map_x_clamped + GRACE + 24 + GRACE, 0xFF))
            goto skip;
        }

        spawn_character(state, charstr);
      }
    }

skip:
    charstr++;
  }
  while (--iters);
}